

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::ES5ArrayTypeHandlerBase<int>::HasAnyDataItemNotInMap
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  IndexPropertyDescriptorMap *this_00;
  bool bVar1;
  bool bVar2;
  uint32 key;
  undefined1 local_40 [8];
  ArrayElementEnumerator e;
  
  JavascriptArray::ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_40,&arr->super_JavascriptArray,0,0xffffffff);
  do {
    bVar1 = JavascriptArray::ArrayElementEnumerator::MoveNext<void*>
                      ((ArrayElementEnumerator *)local_40);
    if (!bVar1) {
      return bVar1;
    }
    this_00 = (this->indexPropertyMap).ptr;
    key = JavascriptArray::ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_40);
    bVar2 = IndexPropertyDescriptorMap::ContainsKey(this_00,key);
  } while (bVar2);
  return bVar1;
}

Assistant:

bool ES5ArrayTypeHandlerBase<T>::HasAnyDataItemNotInMap(ES5Array* arr)
    {
        JavascriptArray::ArrayElementEnumerator e(arr);
        while (e.MoveNext<Var>())
        {
            if (!indexPropertyMap->ContainsKey(e.GetIndex()))
            {
                return true;
            }
        }

        return false;
    }